

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verifyNK.hpp
# Opt level: O2

void njoy::ENDFtk::section::Type<12>::Multiplicities::verifyNK(int NK)

{
  undefined8 *puVar1;
  char *unaff_RBX;
  
  if (0 < NK) {
    return;
  }
  tools::Log::error<char_const*>(unaff_RBX);
  tools::Log::info<char_const*>(unaff_RBX);
  tools::Log::info<char_const*,int>("NK value: {}",NK);
  puVar1 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar1 = getenv;
  __cxa_throw(puVar1,&std::exception::typeinfo,std::exception::~exception);
}

Assistant:

static void
verifyNK( int NK ) {

  if ( NK <= 0 ) {

    Log::error( "Encountered illegal NK value" );
    Log::info( "NK must be larger than 0" );
    Log::info( "NK value: {}", NK );
    throw std::exception();
  }
}